

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

int lj_opt_fwd_sbuf(jit_State *J,IRRef lim)

{
  ushort uVar1;
  IRIns *pIVar2;
  IRRef1 *pIVar3;
  
  if (J->chain[0x56] <= lim) {
    pIVar3 = J->chain + 0x62;
    do {
      uVar1 = *pIVar3;
      if (uVar1 <= lim) {
        pIVar3 = J->chain + 0x61;
        do {
          uVar1 = *pIVar3;
          if (uVar1 <= lim) {
            return 1;
          }
          pIVar2 = (J->cur).ir;
          pIVar3 = &(&pIVar2->field_0)[uVar1].prev;
        } while (0x16 < (ushort)((&pIVar2->field_0)[uVar1].op2 - 7));
        return 0;
      }
      pIVar2 = (J->cur).ir;
      pIVar3 = &(&pIVar2->field_0)[uVar1].prev;
    } while (0x16 < (ushort)((&pIVar2->field_0)[uVar1].op2 - 7));
  }
  return 0;
}

Assistant:

int LJ_FASTCALL lj_opt_fwd_sbuf(jit_State *J, IRRef lim)
{
  IRRef ref;
  if (J->chain[IR_BUFPUT] > lim)
    return 0;  /* Conflict. */
  ref = J->chain[IR_CALLS];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op2 >= IRCALL_lj_strfmt_putint && ir->op2 < IRCALL_lj_buf_tostr)
      return 0;  /* Conflict. */
    ref = ir->prev;
  }
  ref = J->chain[IR_CALLL];
  while (ref > lim) {
    IRIns *ir = IR(ref);
    if (ir->op2 >= IRCALL_lj_strfmt_putint && ir->op2 < IRCALL_lj_buf_tostr)
      return 0;  /* Conflict. */
    ref = ir->prev;
  }
  return 1;  /* No conflict. Can safely FOLD/CSE. */
}